

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

U32 ZSTD_readMINMATCH(void *memPtr,U32 length)

{
  uint uVar1;
  U32 UVar2;
  U32 length_local;
  void *memPtr_local;
  
  if (length == 3) {
    uVar1 = MEM_isLittleEndian();
    if (uVar1 == 0) {
      UVar2 = MEM_read32(memPtr);
      memPtr_local._4_4_ = UVar2 >> 8;
    }
    else {
      UVar2 = MEM_read32(memPtr);
      memPtr_local._4_4_ = UVar2 << 8;
    }
  }
  else {
    memPtr_local._4_4_ = MEM_read32(memPtr);
  }
  return memPtr_local._4_4_;
}

Assistant:

MEM_STATIC U32 ZSTD_readMINMATCH(const void* memPtr, U32 length)
{
    switch (length)
    {
    default :
    case 4 : return MEM_read32(memPtr);
    case 3 : if (MEM_isLittleEndian())
                return MEM_read32(memPtr)<<8;
             else
                return MEM_read32(memPtr)>>8;
    }
}